

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.cpp
# Opt level: O0

void TPZSkylNSymMatrix<float>::ComputeMaxSkyline
               (TPZSkylNSymMatrix<float> *first,TPZSkylNSymMatrix<float> *second,TPZVec<long> *res)

{
  int iVar1;
  int iVar2;
  int64_t column;
  int64_t iVar3;
  long lVar4;
  long *plVar5;
  TPZVec<long> *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  int64_t aux;
  int64_t dim;
  int64_t i;
  int local_40;
  TPZSkylNSymMatrix<float> *in_stack_ffffffffffffffd0;
  long local_20;
  
  column = TPZBaseMatrix::Rows(in_RDI);
  iVar3 = TPZBaseMatrix::Rows(in_RSI);
  if (column == iVar3) {
    iVar3 = TPZBaseMatrix::Rows(in_RDI);
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,iVar3 + 1);
    for (local_20 = 1; local_20 < iVar3 + 1; local_20 = local_20 + 1) {
      iVar1 = Size(in_stack_ffffffffffffffd0,column);
      iVar2 = Size(in_stack_ffffffffffffffd0,column);
      if (iVar2 < iVar1) {
        local_40 = Size(in_stack_ffffffffffffffd0,column);
      }
      else {
        local_40 = Size(in_stack_ffffffffffffffd0,column);
      }
      in_stack_ffffffffffffffd0 = (TPZSkylNSymMatrix<float> *)(long)local_40;
      lVar4 = local_20 - (long)in_stack_ffffffffffffffd0;
      plVar5 = TPZVec<long>::operator[](in_RDX,local_20);
      *plVar5 = lVar4 + -1;
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"ComputeMaxSkyline : incompatible dimension");
  }
  return;
}

Assistant:

void TPZSkylNSymMatrix<TVar>::ComputeMaxSkyline(const TPZSkylNSymMatrix &first,
  const TPZSkylNSymMatrix &second, TPZVec<int64_t> &res)
{

  if (first.Rows() != second.Rows())
  {
    cout << "ComputeMaxSkyline : incompatible dimension";
    return;
  }
  int64_t i, dim = first.Rows();
  res.Resize(dim + 1);

  for (i = 1; i < dim + 1; i++)
  {

    int64_t aux = (first.Size(i) > second.Size(i)) ? first.Size(i) : second.Size(i);
    res[i] = i - aux - 1;
  }
}